

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

pointer __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>
::iterator::operator->(iterator *this)

{
  ctrl_t *ctrl;
  GenerationType generation;
  GenerationType *generation_ptr;
  reference ppVar1;
  iterator *this_local;
  
  ctrl = this->ctrl_;
  generation = HashSetIteratorGenerationInfoDisabled::generation
                         ((HashSetIteratorGenerationInfoDisabled *)this);
  generation_ptr =
       HashSetIteratorGenerationInfoDisabled::generation_ptr
                 ((HashSetIteratorGenerationInfoDisabled *)this);
  AssertIsFull(ctrl,generation,generation_ptr,"operator->");
  ppVar1 = operator*(this);
  return ppVar1;
}

Assistant:

pointer operator->() const {
      AssertIsFull(ctrl_, generation(), generation_ptr(), "operator->");
      return &operator*();
    }